

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O2

QSharedPointer<char> * __thiscall
QSharedPointer<char>::operator=(QSharedPointer<char> *this,QSharedPointer<char> *other)

{
  char *pcVar1;
  Data *pDVar2;
  Data *dd;
  
  pcVar1 = (other->value).ptr;
  pDVar2 = other->d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  dd = this->d;
  this->d = pDVar2;
  (this->value).ptr = pcVar1;
  deref(dd);
  return this;
}

Assistant:

QSharedPointer &operator=(const QSharedPointer &other) noexcept
    {
        QSharedPointer copy(other);
        swap(copy);
        return *this;
    }